

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_astTupleSlotNamedAtNode_primitiveAnalyzeAndEvaluate
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  ulong uVar1;
  sysbvm_tuple_t type;
  size_t slotIndex;
  bool bVar2;
  anon_struct_40_5_e253c8e7 gcFrame;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_tuple_t *local_88;
  sysbvm_tuple_t sStack_80;
  sysbvm_tuple_t local_78;
  sysbvm_tuple_t sStack_70;
  sysbvm_tuple_t local_68;
  sysbvm_stackFrameRecord_t local_60;
  undefined8 local_50;
  sysbvm_stackFrameRecord_t local_48;
  undefined8 local_38;
  undefined1 *puStack_30;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  local_78 = 0;
  sStack_70 = 0;
  local_88 = (sysbvm_tuple_t *)0x0;
  sStack_80 = 0;
  local_68 = 0;
  local_48.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_48.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_48._12_4_ = 0;
  local_38 = 5;
  puStack_30 = (undefined1 *)&local_88;
  sysbvm_stackFrame_pushRecord(&local_48);
  local_60.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_60.type = SYSBVM_STACK_FRAME_RECORD_TYPE_SOURCE_POSITION;
  local_50 = *(undefined8 *)(*arguments + 0x10);
  sysbvm_stackFrame_pushRecord(&local_60);
  local_88 = (sysbvm_tuple_t *)
             sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment
                       (context,*(sysbvm_tuple_t *)(*arguments + 0x28),arguments[1]);
  uVar1 = *(ulong *)(*arguments + 0x38);
  if (uVar1 == 0) {
    sStack_80 = sysbvm_interpreter_evaluateASTWithEnvironment
                          (context,*(sysbvm_tuple_t *)(*arguments + 0x30),arguments[1]);
    uVar1 = (ulong)local_88 & 0xf;
    if (uVar1 == 0 && local_88 != (sysbvm_tuple_t *)0x0) {
      type = *local_88;
    }
    else if ((int)uVar1 == 0xf) {
      type = sysbvm_tuple_getImmediateTrivialTypeWithIndex(context,(ulong)local_88 >> 4);
    }
    else {
      type = sysbvm_tuple_getImmediateTypeWithTag(context,uVar1);
    }
    local_78 = sysbvm_type_lookupSlot(context,type,sStack_80);
    uVar1 = local_78;
    if (local_78 == 0) {
      sysbvm_error("Failed to find the slot with the specified name.");
      uVar1 = local_78;
    }
  }
  local_78 = uVar1;
  bVar2 = (local_78 & 0xf) != 0;
  if (bVar2 || local_78 == 0) {
    slotIndex = 0;
  }
  else {
    uVar1 = *(ulong *)(local_78 + 0x48);
    if (uVar1 == 0 || (uVar1 & 0xf) != 0) {
      slotIndex = (long)uVar1 >> 4;
    }
    else {
      slotIndex = *(size_t *)(uVar1 + 0x10);
    }
  }
  if (bVar2 || local_78 == 0) {
    local_68 = 0;
  }
  else {
    local_68 = *(sysbvm_tuple_t *)(local_78 + 0x30);
  }
  sStack_70 = sysbvm_tuple_slotAt(context,(sysbvm_tuple_t)local_88,slotIndex);
  sStack_70 = sysbvm_type_coerceValue(context,local_68,sStack_70);
  sysbvm_stackFrame_popRecord(&local_60);
  sysbvm_stackFrame_popRecord(&local_48);
  return sStack_70;
}

Assistant:

static sysbvm_tuple_t sysbvm_astTupleSlotNamedAtNode_primitiveAnalyzeAndEvaluate(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_astTupleSlotNamedAtNode_t **node = (sysbvm_astTupleSlotNamedAtNode_t**)&arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    struct {
        sysbvm_tuple_t tuple;
        sysbvm_tuple_t name;
        sysbvm_tuple_t slot;
        sysbvm_tuple_t result;
        sysbvm_tuple_t resultType;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, (*node)->super.sourcePosition);

    gcFrame.tuple = sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment(context, (*node)->tupleExpression, *environment);
    if((*node)->boundSlot)
    {
        gcFrame.slot = (*node)->boundSlot;
    }
    else
    {
        gcFrame.name = sysbvm_interpreter_evaluateASTWithEnvironment(context, (*node)->nameExpression, *environment);
        gcFrame.slot = sysbvm_type_lookupSlot(context, sysbvm_tuple_getType(context, gcFrame.tuple), gcFrame.name);
        if(!gcFrame.slot)
            sysbvm_error("Failed to find the slot with the specified name.");
    }

    size_t slotIndex = sysbvm_typeSlot_getIndex(gcFrame.slot);
    gcFrame.resultType = sysbvm_typeSlot_getType(gcFrame.slot);
    gcFrame.result = sysbvm_tuple_slotAt(context, gcFrame.tuple, slotIndex);
    gcFrame.result = sysbvm_type_coerceValue(context, gcFrame.resultType, gcFrame.result);

    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return gcFrame.result;
}